

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options
          (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__return_storage_ptr__
          ,App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  bool bVar1;
  size_type __n;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_98;
  const_iterator local_90;
  function<bool_(const_CLI::Option_*)> *local_88;
  Option **local_80;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_78;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_70;
  const_iterator local_68;
  Option **local_60;
  Option **local_50;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_48;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  allocator<const_CLI::Option_*> local_22;
  undefined1 local_21;
  function<bool_(const_CLI::Option_*)> *local_20;
  function<bool_(const_CLI::Option_*)> *filter_local;
  App *this_local;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *options;
  
  local_21 = 0;
  local_20 = filter;
  filter_local = (function<bool_(const_CLI::Option_*)> *)this;
  this_local = (App *)__return_storage_ptr__;
  __n = std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::size(&this->options_);
  std::allocator<const_CLI::Option_*>::allocator(&local_22);
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            (__return_storage_ptr__,__n,&local_22);
  std::allocator<const_CLI::Option_*>::~allocator(&local_22);
  local_40 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_48 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  local_50 = (Option **)
             ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                       (__return_storage_ptr__);
  local_60 = (Option **)
             ::std::
             transform<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                       (local_40,local_48,local_50);
  bVar1 = ::std::function::operator_cast_to_bool((function *)filter);
  if (bVar1) {
    local_78._M_current =
         (Option **)
         ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (__return_storage_ptr__);
    local_80 = (Option **)
               ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                         (__return_storage_ptr__);
    local_88 = filter;
    local_70 = ::std::
               remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>
                         (local_78,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                    )local_80,(anon_class_8_1_552cbcb6_for__M_pred)filter);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                *)&local_68,&local_70);
    local_98._M_current =
         (Option **)
         ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                *)&local_90,&local_98);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::erase
              (__return_storage_ptr__,local_68,local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Option *> get_options(const std::function<bool(const Option *)> filter = {}) const {
        std::vector<const Option *> options(options_.size());
        std::transform(std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) {
            return val.get();
        });

        if(filter) {
            options.erase(std::remove_if(std::begin(options),
                                         std::end(options),
                                         [&filter](const Option *opt) { return !filter(opt); }),
                          std::end(options));
        }

        return options;
    }